

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O2

int fy_atom_cmp(fy_atom *atom1,fy_atom *atom2)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *ptr;
  ulong __n;
  char *__s1;
  ulong len;
  ulong len_00;
  fy_atom_iter iter2;
  fy_atom_iter iter1;
  
  if (atom1 == atom2) {
    return 1;
  }
  if (atom2 != (fy_atom *)0x0 && atom1 != (fy_atom *)0x0) {
    len_00 = 0;
    __s1 = (char *)0x0;
    if ((atom1->field_0x35 & 4) != 0) {
      __s1 = fy_atom_data(atom1);
      len_00 = (atom1->end_mark).input_pos - (atom1->start_mark).input_pos;
    }
    if ((atom2->field_0x35 & 4) != 0) {
      ptr = fy_atom_data(atom2);
      len = (atom2->end_mark).input_pos - (atom2->start_mark).input_pos;
      if (ptr != (char *)0x0 && __s1 != (char *)0x0) {
        __n = len;
        if (len_00 < len) {
          __n = len_00;
        }
        iVar1 = memcmp(__s1,ptr,__n);
        if (iVar1 != 0) {
          return iVar1;
        }
        if (len_00 != len) {
          return -(uint)(len_00 < len) | 1;
        }
        return 0;
      }
      if (ptr != (char *)0x0) {
        iVar1 = fy_atom_memcmp(atom1,ptr,len);
        return iVar1;
      }
    }
    if (__s1 != (char *)0x0) {
      iVar1 = fy_atom_memcmp(atom2,__s1,len_00);
      return -iVar1;
    }
    fy_atom_iter_start(atom1,&iter1);
    fy_atom_iter_start(atom2,&iter2);
    do {
      uVar2 = fy_atom_iter_getc(&iter1);
      uVar3 = fy_atom_iter_getc(&iter2);
      if (uVar2 != uVar3) break;
    } while (-1 < (int)(uVar3 | uVar2));
    fy_atom_iter_finish(&iter2);
    fy_atom_iter_finish(&iter1);
    if ((uVar3 & uVar2) != 0xffffffff) {
      return (uint)((int)uVar3 <= (int)uVar2) * 2 + -1;
    }
  }
  return 0;
}

Assistant:

int fy_atom_cmp(struct fy_atom *atom1, struct fy_atom *atom2) {
    struct fy_atom_iter iter1, iter2;
    const char *d1, *d2;
    size_t l1, l2, l;
    int c1, c2, ret;

    /* handles NULL case too */
    if (atom1 == atom2)
        return true;

    /* either null, can't do */
    if (!atom1 || !atom2)
        return false;

    /* direct output? */
    if (atom1->direct_output) {
        d1 = fy_atom_data(atom1);
        l1 = fy_atom_size(atom1);
    } else {
        d1 = NULL;
        l1 = 0;
    }
    if (atom2->direct_output) {
        d2 = fy_atom_data(atom2);
        l2 = fy_atom_size(atom2);
    } else {
        d2 = NULL;
        l2 = 0;
    }

    /* we have both atoms with direct output */
    if (d1 && d2) {
        l = l1 > l2 ? l2 : l1;
        ret = memcmp(d1, d2, l);
        if (ret)
            return ret;
        return l1 == l2 ? 0 : l2 > l1 ? -1 : 1;
    }

    /* only atom2 is direct */
    if (d2)
        return fy_atom_memcmp(atom1, d2, l2);

    /* only atom1 is direct, (note reversing sign) */
    if (d1)
        return -fy_atom_memcmp(atom2, d1, l1);

    /* neither is direct, do it with iterators */
    fy_atom_iter_start(atom1, &iter1);
    fy_atom_iter_start(atom2, &iter2);
    do {
        c1 = fy_atom_iter_getc(&iter1);
        c2 = fy_atom_iter_getc(&iter2);
    } while (c1 == c2 && c1 >= 0 && c2 >= 0);
    fy_atom_iter_finish(&iter2);
    fy_atom_iter_finish(&iter1);

    if (c1 == -1 && c2 == -1)
        return 0;

    return c2 > c1 ? -1 : 1;
}